

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.c
# Opt level: O0

char * lua_setupvalue(lua_State *L,int funcindex,int n)

{
  StkId pTVar1;
  TValue *fi_00;
  TValue *o1;
  TValue *o2;
  StkId fi;
  TValue *val;
  char *name;
  int n_local;
  int funcindex_local;
  lua_State *L_local;
  
  name._0_4_ = n;
  name._4_4_ = funcindex;
  _n_local = L;
  fi_00 = index2adr(L,funcindex);
  val = (TValue *)aux_upvalue(fi_00,(int)name,&fi);
  if (val != (TValue *)0x0) {
    _n_local->top = _n_local->top + -1;
    pTVar1 = _n_local->top;
    fi->value = pTVar1->value;
    fi->tt = pTVar1->tt;
    if (((3 < _n_local->top->tt) && (((((_n_local->top->value).gc)->gch).marked & 3) != 0)) &&
       (((((fi_00->value).gc)->gch).marked & 4) != 0)) {
      luaC_barrierf(_n_local,(fi_00->value).gc,(_n_local->top->value).gc);
    }
  }
  return (char *)val;
}

Assistant:

LUA_API const char *lua_setupvalue (lua_State *L, int funcindex, int n) {
  const char *name;
  TValue *val;
  StkId fi;
  lua_lock(L);
  fi = index2adr(L, funcindex);
  api_checknelems(L, 1);
  name = aux_upvalue(fi, n, &val);
  if (name) {
    L->top--;
    setobj(L, val, L->top);
    luaC_barrier(L, clvalue(fi), L->top);
  }
  lua_unlock(L);
  return name;
}